

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

void * __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldDefault
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long *plVar1;
  
  if (field[0x50] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x58) + 0x30);
  }
  else if (*(long *)(field + 0x68) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x30) + 0x98);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x68) + 0x80);
  }
  return (void *)((long)&(this->default_instance_->super_MessageLite)._vptr_MessageLite +
                 (ulong)this->offsets_[(int)((ulong)((long)field - *plVar1) >> 3) * 0x3cf3cf3d]);
}

Assistant:

const void *GetFieldDefault(const FieldDescriptor* field) const {
    return reinterpret_cast<const uint8*>(default_instance_) +
                     offsets_[field->index()];
  }